

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  string_view module_name;
  Result RVar2;
  RegisterCommand *this_00;
  Enum EVar3;
  string text;
  Location loc;
  Var var;
  Location local_88;
  Var local_68;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ != Error) {
    GetLocation(&loc,this);
    RVar2 = Expect(this,Register);
    if (RVar2.enum_ != Error) {
      text._M_dataplus._M_p = (pointer)&text.field_2;
      text._M_string_length = 0;
      text.field_2._M_local_buf[0] = '\0';
      local_88.field_1.field_0.line = 0;
      local_88.field_1._4_8_ = 0;
      local_88.filename.data_ = (char *)0x0;
      local_88.filename.size_._0_4_ = 0;
      local_88.filename.size_._4_4_ = 0;
      Var::Var(&var,0xffffffff,&local_88);
      RVar2 = ParseQuotedText(this,&text);
      EVar3 = Error;
      if (RVar2.enum_ != Error) {
        Var::Var(&local_68,this->last_module_index_,&loc);
        ParseVarOpt(this,&var,&local_68);
        Var::~Var(&local_68);
        RVar2 = Expect(this,Rpar);
        if (RVar2.enum_ != Error) {
          this_00 = (RegisterCommand *)operator_new(0x78);
          module_name.size_ = text._M_string_length;
          module_name.data_ = text._M_dataplus._M_p;
          RegisterCommand::RegisterCommand(this_00,module_name,&var);
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)this_00;
          EVar3 = Ok;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
            EVar3 = Ok;
          }
        }
      }
      Var::~Var(&var);
      std::__cxx11::string::_M_dispose();
      return (Result)EVar3;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}